

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

int __thiscall network::add_object(network *this,iobject *object)

{
  int iVar1;
  pair<int,_iobject_*> local_18;
  
  if (object->netid_ == 0) {
    iVar1 = this->last_netid_ + 1;
    this->last_netid_ = iVar1;
    object->netid_ = iVar1;
    local_18.first = iVar1;
    local_18.second = object;
    std::
    _Rb_tree<int,std::pair<int_const,iobject*>,std::_Select1st<std::pair<int_const,iobject*>>,std::less<int>,std::allocator<std::pair<int_const,iobject*>>>
    ::_M_emplace_unique<std::pair<int,iobject*>>
              ((_Rb_tree<int,std::pair<int_const,iobject*>,std::_Select1st<std::pair<int_const,iobject*>>,std::less<int>,std::allocator<std::pair<int_const,iobject*>>>
                *)&this->objects_,&local_18);
    return iVar1;
  }
  __assert_fail("object->get_netid() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/network.cpp"
                ,0x7b,"int network::add_object(iobject *)");
}

Assistant:

int network::add_object(iobject* object)
{
    assert(object->get_netid() == 0);
    int netid = new_netid();
    object->set_netid(netid);
    objects_.insert(std::make_pair(netid, object));
    return netid;
}